

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack16.h
# Opt level: O3

void ncnn::conv3x3s1_winograd43_transform_kernel_pack16_avx512
               (Mat *kernel,Mat *kernel_tm_pack16,int inch,int outch,Option *opt)

{
  void *pvVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined8 uVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  byte bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int *piVar16;
  int j;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined4 *puVar20;
  int iVar21;
  void *pvVar22;
  long lVar23;
  undefined8 *puVar24;
  undefined8 *puVar25;
  long lVar26;
  int iVar27;
  void *pvVar28;
  undefined8 *puVar29;
  undefined8 in_R11;
  undefined4 *puVar30;
  undefined4 *puVar31;
  int i;
  long lVar32;
  undefined4 *puVar33;
  void *pvVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  undefined1 auVar38 [32];
  undefined1 auVar40 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  float tmp [6] [3];
  Mat local_c8;
  uint local_78;
  undefined8 auStack_74 [8];
  undefined1 auVar39 [32];
  undefined1 auVar41 [32];
  
  puVar24 = (undefined8 *)(ulong)(uint)outch;
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,0x24,inch,outch,4,(Allocator *)0x0);
  if (0 < outch) {
    pvVar5 = kernel->data;
    auVar44 = vpbroadcastq_avx512f();
    auVar45 = vpaddq_avx512f(auVar44,_DAT_00516c00);
    auVar46 = vpaddq_avx512f(auVar44,_DAT_00516c40);
    auVar44 = vpaddq_avx512f(auVar44,_DAT_00516c80);
    puVar29 = (undefined8 *)0x0;
    pvVar22 = local_c8.data;
    puVar25 = puVar24;
    do {
      if (0 < inch) {
        pvVar1 = (void *)((long)pvVar5 + (long)(inch * 9 * (int)puVar29) * 4);
        uVar35 = 0;
        pvVar34 = pvVar22;
        do {
          uVar37 = CONCAT71((int7)((ulong)in_R11 >> 8),0x3f) & 0xffffffff;
          auVar38 = vgatherdps_avx512vl(*(undefined4 *)(puVar25 + 0xa2eac));
          bVar8 = (byte)uVar37;
          auVar39._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar38._4_4_;
          auVar39._0_4_ = (uint)(bVar8 & 1) * auVar38._0_4_;
          auVar39._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar38._8_4_;
          auVar39._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar38._12_4_;
          auVar39._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar38._16_4_;
          auVar39._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar38._20_4_;
          auVar39._24_8_ = 0;
          uVar2 = *(undefined4 *)((long)pvVar1 + uVar35 * 0x24);
          auVar38._4_4_ = uVar2;
          auVar38._0_4_ = uVar2;
          auVar38._8_4_ = uVar2;
          auVar38._12_4_ = uVar2;
          auVar38._16_4_ = uVar2;
          auVar38._20_4_ = uVar2;
          auVar38._24_4_ = uVar2;
          auVar38._28_4_ = uVar2;
          auVar38 = vmulps_avx512vl(auVar39,auVar38);
          auVar40 = vgatherdps_avx512vl(0x3e800000);
          auVar41._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar40._4_4_;
          auVar41._0_4_ = (uint)(bVar8 & 1) * auVar40._0_4_;
          auVar41._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar40._8_4_;
          auVar41._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar40._12_4_;
          auVar41._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar40._16_4_;
          auVar41._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar40._20_4_;
          auVar41._24_8_ = 0;
          uVar2 = *(undefined4 *)((long)pvVar1 + uVar35 * 0x24 + 4);
          auVar40._4_4_ = uVar2;
          auVar40._0_4_ = uVar2;
          auVar40._8_4_ = uVar2;
          auVar40._12_4_ = uVar2;
          auVar40._16_4_ = uVar2;
          auVar40._20_4_ = uVar2;
          auVar40._24_4_ = uVar2;
          auVar40._28_4_ = uVar2;
          auVar38 = vfmadd231ps_avx512vl(auVar38,auVar41,auVar40);
          auVar40 = vgatherdps_avx512vl(*(undefined4 *)((long)&DAT_00517560 + (long)pvVar1));
          auVar42._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar40._4_4_;
          auVar42._0_4_ = (uint)(bVar8 & 1) * auVar40._0_4_;
          auVar42._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar40._8_4_;
          auVar42._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar40._12_4_;
          auVar42._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar40._16_4_;
          auVar42._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar40._20_4_;
          auVar42._24_8_ = 0;
          uVar2 = *(undefined4 *)((long)pvVar1 + uVar35 * 0x24 + 8);
          auVar43._4_4_ = uVar2;
          auVar43._0_4_ = uVar2;
          auVar43._8_4_ = uVar2;
          auVar43._12_4_ = uVar2;
          auVar43._16_4_ = uVar2;
          auVar43._20_4_ = uVar2;
          auVar43._24_4_ = uVar2;
          auVar43._28_4_ = uVar2;
          auVar38 = vfmadd231ps_avx512vl(auVar38,auVar42,auVar43);
          uVar2 = *(undefined4 *)((long)pvVar1 + uVar35 * 0x24 + 0xc);
          auVar10._4_4_ = uVar2;
          auVar10._0_4_ = uVar2;
          auVar10._8_4_ = uVar2;
          auVar10._12_4_ = uVar2;
          auVar10._16_4_ = uVar2;
          auVar10._20_4_ = uVar2;
          auVar10._24_4_ = uVar2;
          auVar10._28_4_ = uVar2;
          auVar40 = vmulps_avx512vl(auVar39,auVar10);
          uVar2 = *(undefined4 *)((long)pvVar1 + uVar35 * 0x24 + 0x10);
          auVar11._4_4_ = uVar2;
          auVar11._0_4_ = uVar2;
          auVar11._8_4_ = uVar2;
          auVar11._12_4_ = uVar2;
          auVar11._16_4_ = uVar2;
          auVar11._20_4_ = uVar2;
          auVar11._24_4_ = uVar2;
          auVar11._28_4_ = uVar2;
          auVar40 = vfmadd231ps_avx512vl(auVar40,auVar41,auVar11);
          uVar2 = *(undefined4 *)((long)pvVar1 + uVar35 * 0x24 + 0x14);
          auVar12._4_4_ = uVar2;
          auVar12._0_4_ = uVar2;
          auVar12._8_4_ = uVar2;
          auVar12._12_4_ = uVar2;
          auVar12._16_4_ = uVar2;
          auVar12._20_4_ = uVar2;
          auVar12._24_4_ = uVar2;
          auVar12._28_4_ = uVar2;
          auVar40 = vfmadd231ps_avx512vl(auVar40,auVar42,auVar12);
          uVar2 = *(undefined4 *)((long)pvVar1 + uVar35 * 0x24 + 0x18);
          auVar13._4_4_ = uVar2;
          auVar13._0_4_ = uVar2;
          auVar13._8_4_ = uVar2;
          auVar13._12_4_ = uVar2;
          auVar13._16_4_ = uVar2;
          auVar13._20_4_ = uVar2;
          auVar13._24_4_ = uVar2;
          auVar13._28_4_ = uVar2;
          auVar43 = vmulps_avx512vl(auVar39,auVar13);
          uVar2 = *(undefined4 *)((long)pvVar1 + uVar35 * 0x24 + 0x1c);
          auVar14._4_4_ = uVar2;
          auVar14._0_4_ = uVar2;
          auVar14._8_4_ = uVar2;
          auVar14._12_4_ = uVar2;
          auVar14._16_4_ = uVar2;
          auVar14._20_4_ = uVar2;
          auVar14._24_4_ = uVar2;
          auVar14._28_4_ = uVar2;
          auVar43 = vfmadd231ps_avx512vl(auVar43,auVar41,auVar14);
          uVar2 = *(undefined4 *)((long)pvVar1 + uVar35 * 0x24 + 0x20);
          auVar15._4_4_ = uVar2;
          auVar15._0_4_ = uVar2;
          auVar15._8_4_ = uVar2;
          auVar15._12_4_ = uVar2;
          auVar15._16_4_ = uVar2;
          auVar15._20_4_ = uVar2;
          auVar15._24_4_ = uVar2;
          auVar15._28_4_ = uVar2;
          auVar43 = vfmadd231ps_avx512vl(auVar43,auVar42,auVar15);
          vscatterqps_avx512f(ZEXT864(0) + auVar45,uVar37,auVar38);
          vscatterqps_avx512f(ZEXT864(0) + auVar46,uVar37,auVar40);
          vscatterqps_avx512f(ZEXT864(0) + auVar44,uVar37,auVar43);
          lVar17 = 0;
          pvVar28 = pvVar34;
          do {
            uVar3 = *(uint *)((long)auStack_74 + lVar17 * 0xc + -4);
            uVar4 = *(undefined8 *)((long)auStack_74 + lVar17 * 0xc);
            puVar25 = &DAT_00517564;
            lVar32 = 0;
            do {
              auVar47._0_4_ = (float)*puVar25 * (float)uVar4;
              auVar47._4_4_ = (float)((ulong)*puVar25 >> 0x20) * (float)((ulong)uVar4 >> 0x20);
              auVar47._8_8_ = 0;
              auVar9 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar25 + -4)),auVar47,ZEXT416(uVar3)
                                      );
              auVar47 = vmovshdup_avx(auVar47);
              *(float *)((long)pvVar28 + lVar32 * 4) = auVar9._0_4_ + auVar47._0_4_;
              lVar32 = lVar32 + 1;
              puVar25 = (undefined8 *)((long)puVar25 + 0xc);
            } while (lVar32 != 6);
            lVar17 = lVar17 + 1;
            pvVar28 = (void *)((long)pvVar28 + 0x18);
          } while (lVar17 != 6);
          uVar35 = uVar35 + 1;
          pvVar34 = (void *)((long)pvVar34 +
                            (long)local_c8.w *
                            CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
        } while (uVar35 != (uint)inch);
      }
      puVar29 = (undefined8 *)((long)puVar29 + 1);
      pvVar22 = (void *)((long)pvVar22 +
                        local_c8.cstep *
                        CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
    } while (puVar29 != puVar24);
  }
  iVar27 = inch + 0xf;
  if (-1 < inch) {
    iVar27 = inch;
  }
  iVar21 = outch + 0xf;
  if (-1 < outch) {
    iVar21 = outch;
  }
  Mat::create(kernel_tm_pack16,iVar27 >> 4,0x24,iVar21 >> 4,0x400,0x100,(Allocator *)0x0);
  if (0xf < outch) {
    iVar27 = kernel_tm_pack16->w;
    pvVar5 = kernel_tm_pack16->data;
    sVar6 = kernel_tm_pack16->elemsize;
    sVar7 = kernel_tm_pack16->cstep;
    uVar35 = 0;
    do {
      lVar32 = local_c8.cstep * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
      puVar33 = (undefined4 *)(lVar32 * uVar35 + (long)local_c8.data);
      lVar17 = (long)local_c8.w * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
      lVar36 = 0;
      do {
        if (0xf < inch) {
          lVar18 = (long)pvVar5 + (long)iVar27 * sVar6 * lVar36 + (uVar35 >> 4) * sVar7 * sVar6;
          lVar26 = 0;
          puVar30 = puVar33;
          do {
            lVar23 = 0;
            puVar31 = puVar30;
            do {
              lVar19 = lVar18;
              lVar18 = 0;
              puVar20 = puVar31;
              do {
                *(undefined4 *)(lVar19 + lVar18) = *puVar20;
                puVar20 = (undefined4 *)((long)puVar20 + lVar32);
                lVar18 = lVar18 + 4;
              } while (lVar18 != 0x40);
              lVar23 = lVar23 + 1;
              puVar31 = (undefined4 *)((long)puVar31 + lVar17);
              lVar18 = lVar19 + 0x40;
            } while (lVar23 != 0x10);
            lVar23 = lVar26 + 0x1f;
            puVar30 = puVar30 + lVar17 * 4;
            lVar18 = lVar19 + 0x40;
            lVar26 = lVar26 + 0x10;
          } while (lVar23 < inch);
        }
        lVar36 = lVar36 + 1;
        puVar33 = puVar33 + 1;
      } while (lVar36 != 0x24);
      puVar25 = (undefined8 *)(uVar35 + 0x1f);
      uVar35 = uVar35 + 0x10;
    } while (puVar25 < puVar24);
  }
  piVar16 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel_pack16_avx512(const Mat& kernel, Mat& kernel_tm_pack16, int inch, int outch, const Option& opt)
{
    // winograd43 transform kernel
    Mat kernel_tm(6 * 6, inch, outch);

    const float ktm[6][3] = {
        {1.0f / 4, 0.0f, 0.0f},
        {-1.0f / 6, -1.0f / 6, -1.0f / 6},
        {-1.0f / 6, 1.0f / 6, -1.0f / 6},
        {1.0f / 24, 1.0f / 12, 1.0f / 6},
        {1.0f / 24, -1.0f / 12, 1.0f / 6},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[6][3];
            for (int i = 0; i < 6; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 6; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 6; i++)
                {
                    kernel_tm0[j * 6 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 36-inch-outch
    // dst = 16b-16a-inch/16a-36-outch/16b
    kernel_tm_pack16.create(inch / 16, 36, outch / 16, (size_t)4u * 16 * 16, 16 * 16);
    for (int q = 0; q + 15 < outch; q += 16)
    {
        Mat g0 = kernel_tm_pack16.channel(q / 16);

        for (int k = 0; k < 36; k++)
        {
            float* g00 = g0.row<float>(k);

            for (int p = 0; p + 15 < inch; p += 16)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 16; j++)
                    {
                        const float* k00 = kernel_tm.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}